

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

bool __thiscall WorldShuffler::is_region_avoidable(WorldShuffler *this,WorldRegion *region)

{
  WorldNode *start_node;
  bool bVar1;
  mapped_type *ppWVar2;
  WorldNode *end_node;
  WorldSolver solver;
  vector<Item_*,_std::allocator<Item_*>_> local_168;
  WorldSolver local_150;
  
  WorldSolver::WorldSolver(&local_150,this->_world);
  WorldSolver::forbid_taking_items_from_nodes(&local_150,&region->_nodes);
  ppWVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
            ::at(&this->_world->_nodes,&this->_world->_spawn_location->_node_id);
  start_node = *ppWVar2;
  end_node = RandomizerWorld::end_node(this->_world);
  World::starting_inventory(&local_168,&this->_world->super_World);
  bVar1 = WorldSolver::try_to_solve(&local_150,start_node,end_node,&local_168);
  if (local_168.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  WorldSolver::~WorldSolver(&local_150);
  return bVar1;
}

Assistant:

bool WorldShuffler::is_region_avoidable(WorldRegion* region) const
{
    WorldSolver solver(_world);
    solver.forbid_taking_items_from_nodes(region->nodes());
    return solver.try_to_solve(_world.spawn_node(), _world.end_node(), _world.starting_inventory());
}